

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

ImRect ImGui::TableGetCellBgRect(ImGuiTable *table,int column_n)

{
  float fVar1;
  float fVar2;
  ImGuiTableColumn *pIVar3;
  uint uVar4;
  float fVar5;
  ImRect IVar6;
  
  pIVar3 = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,column_n);
  fVar1 = (table->WorkRect).Min.x;
  uVar4 = -(uint)(fVar1 <= pIVar3->MinX);
  fVar2 = (table->WorkRect).Max.x;
  fVar5 = pIVar3->MaxX;
  if (fVar2 <= pIVar3->MaxX) {
    fVar5 = fVar2;
  }
  IVar6.Max.y = table->RowPosY2;
  IVar6.Max.x = fVar5;
  IVar6.Min.y = table->RowPosY1;
  IVar6.Min.x = (float)(~uVar4 & (uint)fVar1 | (uint)pIVar3->MinX & uVar4);
  return IVar6;
}

Assistant:

ImRect ImGui::TableGetCellBgRect(const ImGuiTable* table, int column_n)
{
    const ImGuiTableColumn* column = &table->Columns[column_n];
    float x1 = column->MinX;
    float x2 = column->MaxX;
    //if (column->PrevEnabledColumn == -1)
    //    x1 -= table->OuterPaddingX;
    //if (column->NextEnabledColumn == -1)
    //    x2 += table->OuterPaddingX;
    x1 = ImMax(x1, table->WorkRect.Min.x);
    x2 = ImMin(x2, table->WorkRect.Max.x);
    return ImRect(x1, table->RowPosY1, x2, table->RowPosY2);
}